

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateWrappedExternalFunction
          (JavascriptLibrary *this,JavascriptExternalFunction *wrappedFunction)

{
  JavascriptExternalFunction *entryPoint;
  int iVar1;
  Recycler *pRVar2;
  JavascriptExternalFunction *this_00;
  DynamicType **ppDVar3;
  undefined4 extraout_var;
  TrackAllocData local_48;
  JavascriptExternalFunction *local_20;
  JavascriptExternalFunction *function;
  JavascriptExternalFunction *wrappedFunction_local;
  JavascriptLibrary *this_local;
  
  function = wrappedFunction;
  wrappedFunction_local = (JavascriptExternalFunction *)this;
  pRVar2 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&JavascriptExternalFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a2e);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
  this_00 = (JavascriptExternalFunction *)new<Memory::Recycler>(0x70,pRVar2,0x43c4b0);
  entryPoint = function;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->wrappedFunctionWithDeferredPrototypeType);
  JavascriptExternalFunction::JavascriptExternalFunction(this_00,entryPoint,*ppDVar3);
  local_20 = this_00;
  iVar1 = (*(function->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6c])();
  RuntimeFunction::SetFunctionNameId((RuntimeFunction *)this_00,(Var)CONCAT44(extraout_var,iVar1));
  return local_20;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateWrappedExternalFunction(JavascriptExternalFunction* wrappedFunction)
    {
        // The wrapped function will have profiling, so the wrapper function does not need it.
        JavascriptExternalFunction* function = RecyclerNew(this->GetRecycler(), JavascriptExternalFunction, wrappedFunction, wrappedFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(wrappedFunction->GetSourceString());

        return function;
    }